

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# completion_handler.hpp
# Opt level: O1

void asio::detail::
     completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseSession.cpp:570:33)>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  atomic<int> *paVar1;
  type tVar2;
  long lVar3;
  type handler;
  ptr p;
  type local_30;
  ptr local_28;
  
  local_30.this = (ApplicationSession *)base[1].next_;
  local_28.h = &local_30;
  local_28.v = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseSession_cpp:570:33)>
                *)base;
  local_28.p = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseSession_cpp:570:33)>
                *)base;
  ptr::reset(&local_28);
  tVar2.this = local_30.this;
  if (owner != (void *)0x0) {
    tonk::UDPSocket::CloseSocket(&(local_30.this)->MainSocket);
    if ((tVar2.this)->P2PSocketsInitialized == true) {
      lVar3 = 0x400;
      do {
        tonk::UDPSocket::CloseSocket
                  ((UDPSocket *)
                   ((long)&((tVar2.this)->super_INATPortPool)._vptr_INATPortPool + lVar3));
        lVar3 = lVar3 + 0x1a0;
      } while (lVar3 != 0x3800);
    }
    LOCK();
    paVar1 = &((tVar2.this)->SelfRefCount).RefCount;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + -1;
    UNLOCK();
  }
  ptr::reset(&local_28);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    completion_handler* h(static_cast<completion_handler*>(base));
    ptr p = { asio::detail::addressof(h->handler_), h, h };
    handler_work<Handler> w(h->handler_);

    ASIO_HANDLER_COMPLETION((*h));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    Handler handler(ASIO_MOVE_CAST(Handler)(h->handler_));
    p.h = asio::detail::addressof(handler);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN(());
      w.complete(handler, handler);
      ASIO_HANDLER_INVOCATION_END;
    }
  }